

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joypad.c
# Opt level: O0

Result joypad_write(JoypadBuffer *buffer,FileData *file_data)

{
  long lVar1;
  size_t chunk_size;
  u8 *p;
  JoypadChunk *chunk;
  FileData *file_data_local;
  JoypadBuffer *buffer_local;
  
  chunk_size = (size_t)file_data->data;
  for (p = (u8 *)(buffer->sentinel).next; (JoypadBuffer *)p != buffer; p = *(u8 **)(p + 0x18)) {
    lVar1 = *(long *)(p + 8);
    memcpy((void *)chunk_size,*(void **)p,lVar1 * 0x10);
    chunk_size = lVar1 * 0x10 + chunk_size;
  }
  return OK;
}

Assistant:

Result joypad_write(JoypadBuffer* buffer, FileData* file_data) {
  JoypadChunk* chunk = buffer->sentinel.next;
  u8* p = file_data->data;
  while (chunk != &buffer->sentinel) {
    size_t chunk_size = chunk->size * sizeof(JoypadState);
    memcpy(p, chunk->data, chunk_size);
    p += chunk_size;
    chunk = chunk->next;
  }
  return OK;
}